

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,TouchPoint *p)

{
  QDebug *pQVar1;
  long in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  QDebug *in_stack_ffffffffffffff68;
  QDebug this;
  QDebug *this_00;
  QVector2D vector;
  QDebug local_48;
  undefined1 local_40 [8];
  QDebug local_38;
  undefined1 local_30 [8];
  QDebug local_28;
  QDebug local_20;
  undefined1 *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  vector.v = (float  [2])&local_18;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)vector.v,in_RSI);
  QDebug::nospace(in_RSI);
  QDebug::operator<<(in_stack_ffffffffffffff68,(char *)vector.v);
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff4c);
  pQVar1 = QDebug::operator<<(in_stack_ffffffffffffff68,(char *)vector.v);
  this_00 = &local_48;
  QDebug::QDebug(this_00,pQVar1);
  operator<<((Stream *)local_40,(QRectF *)this_00);
  pQVar1 = QDebug::operator<<(in_stack_ffffffffffffff68,(char *)vector.v);
  QDebug::QDebug(&local_38,pQVar1);
  this.stream = (Stream *)local_30;
  operator<<(this,(QPointF *)&local_38);
  QDebug::operator<<((QDebug *)this.stream,(char *)vector.v);
  QDebug::operator<<((QDebug *)in_RDI,
                     (double)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pQVar1 = QDebug::operator<<((QDebug *)this.stream,(char *)vector.v);
  QDebug::QDebug(&local_28,pQVar1);
  local_10 = *(undefined8 *)(in_RDX + 0x54);
  operator<<(this_00,vector);
  QDebug::operator<<((QDebug *)this.stream,(char *)vector.v);
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff4c);
  QDebug::~QDebug(&local_20);
  QDebug::~QDebug(&local_28);
  QDebug::~QDebug((QDebug *)this.stream);
  QDebug::~QDebug(&local_38);
  QDebug::~QDebug((QDebug *)local_40);
  QDebug::~QDebug(this_00);
  QDebug::QDebug((QDebug *)in_RDI,
                 (QDebug *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)vector.v);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Q_GUI_EXPORT QDebug operator<<(QDebug dbg, const QWindowSystemInterface::TouchPoint &p)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "TouchPoint(" << p.id << " @" << p.area << " normalized " << p.normalPosition
                  << " press " << p.pressure << " vel " << p.velocity << " state " << (int)p.state;
    return dbg;
}